

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

char * max_expand(MatchState *ms,char *s,char *p,char *ep)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = ms->src_end;
  if (s < pcVar2) {
    lVar3 = 0;
    do {
      iVar1 = singlematch((uint)(byte)s[lVar3],p,ep);
      if (iVar1 == 0) break;
      lVar3 = lVar3 + 1;
    } while ((long)pcVar2 - (long)s != lVar3);
  }
  else {
    lVar3 = 0;
  }
  do {
    if (lVar3 < 0) {
      return (char *)0x0;
    }
    pcVar2 = match(ms,s + lVar3,ep + 1);
    lVar3 = lVar3 + -1;
  } while (pcVar2 == (char *)0x0);
  return pcVar2;
}

Assistant:

static const char*max_expand(MatchState*ms,const char*s,
const char*p,const char*ep){
ptrdiff_t i=0;
while((s+i)<ms->src_end&&singlematch(uchar(*(s+i)),p,ep))
i++;
while(i>=0){
const char*res=match(ms,(s+i),ep+1);
if(res)return res;
i--;
}
return NULL;
}